

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::ArgumentStringlist::print_value(ArgumentStringlist *this,ostream *os)

{
  ostream *poVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  std::operator<<(os,'[');
  lVar2 = 0;
  for (uVar3 = 0;
      uVar3 < (ulong)((long)(this->dest_->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->dest_->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 5); uVar3 = uVar3 + 1) {
    if (uVar3 != 0) {
      std::operator<<(os,',');
    }
    poVar1 = std::operator<<(os,'\"');
    poVar1 = std::operator<<(poVar1,(string *)
                                    ((long)&(((this->dest_->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->
                                            _M_dataplus)._M_p + lVar2));
    std::operator<<(poVar1,'\"');
    lVar2 = lVar2 + 0x20;
  }
  std::operator<<(os,']');
  return;
}

Assistant:

void print_value(std::ostream& os) const final {
        os << '[';
        for (size_t i = 0; i < dest_.size(); ++i) {
            if (i != 0)
                os << ',';
            os << '"' << dest_[i] << '"';
        }
        os << ']';
    }